

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::
List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
~List(List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      *this)

{
  ~List(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~List() override
        {
            this->Reset();
        }